

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::clara::detail::BasicResult<void>::BasicResult
          (BasicResult<void> *this,Type type,string *message)

{
  (this->super_ResultValueBase<void>).super_ResultBase.m_type = type;
  (this->super_ResultValueBase<void>).super_ResultBase._vptr_ResultBase =
       (_func_int **)&PTR__BasicResult_00199430;
  ::std::__cxx11::string::string((string *)&this->m_errorMessage,(string *)message);
  if ((this->super_ResultValueBase<void>).super_ResultBase.m_type != Ok) {
    return;
  }
  __assert_fail("m_type != ResultBase::Ok",
                "/workspace/llm4binary/github/license_c_cmakelists/0neblock[P]Arduino_SNMP/tests/catch.hpp"
                ,0x2349,
                "Catch::clara::detail::BasicResult<>::BasicResult(ResultBase::Type, const std::string &) [T = void]"
               );
}

Assistant:

BasicResult( ResultBase::Type type, std::string const &message )
        :   ResultValueBase<T>(type),
            m_errorMessage(message)
        {
            assert( m_type != ResultBase::Ok );
        }